

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inflate_stream.cpp
# Opt level: O2

void __thiscall
boost::deflate::inflate_stream_test::Matrix::operator()(Matrix *this,Boost *f,string *check)

{
  string *__return_storage_ptr__;
  uint uVar1;
  int level;
  int memLevel;
  int in_stack_ffffffffffffff90;
  undefined1 local_60 [48];
  
  __return_storage_ptr__ = (string *)(local_60 + 0x10);
  for (uVar1 = this->level_[0]; (int)uVar1 <= this->level_[1]; uVar1 = uVar1 + 1) {
    for (level = this->window_[0]; level <= this->window_[1]; level = level + 1) {
      for (memLevel = this->strategy_[0]; memLevel <= this->strategy_[1]; memLevel = memLevel + 1) {
        local_60._0_8_ = (check->_M_dataplus)._M_p;
        local_60._8_8_ = check->_M_string_length;
        compress_abi_cxx11_(__return_storage_ptr__,(inflate_stream_test *)local_60,
                            (string_view *)(ulong)uVar1,level,0,4,memLevel,in_stack_ffffffffffffff90
                           );
        Boost::operator()(f,level,__return_storage_ptr__,check);
        std::__cxx11::string::~string((string *)__return_storage_ptr__);
      }
    }
  }
  return;
}

Assistant:

void operator()(
            F const& f,
            std::string const& check) const
        {
            for(auto level = level_[0];
                level <= level_[1]; ++level)
            {
                for(auto window = window_[0];
                    window <= window_[1]; ++window)
                {
                    for(auto strategy = strategy_[0];
                        strategy <= strategy_[1]; ++strategy)
                        f(
                            window,
                            compress(check, level, window,boost::deflate::wrap::none, 4, strategy),
                            check);
                }
            }
        }